

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O2

uint64_t lj_carith_check64(lua_State *L,int narg,CTypeID *id)

{
  ushort uVar1;
  CType *pCVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  CType *s;
  CTState *cts;
  uint8_t *sp;
  TValue *o;
  uint64_t x;
  
  o = L->base + (long)narg + -1;
  if (L->top <= o) goto LAB_0014995b;
  uVar3 = *(uint *)((long)L->base + (long)narg * 8 + -4);
  if (uVar3 < 0xffff0000) {
LAB_0014989c:
    return (ulong)(o->n + 6755399441055744.0) & 0xffffffff;
  }
  if ((short)uVar3 == -5) {
    iVar4 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o);
    if (iVar4 == 0) {
LAB_0014995b:
      lj_err_argt(L,narg,3);
    }
    goto LAB_0014989c;
  }
  if ((uVar3 & 0xffff) != 0xfff5) goto LAB_0014995b;
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  uVar1 = *(ushort *)((ulong)(o->u32).lo + 6);
  uVar3 = (uint)uVar1;
  sp = (uint8_t *)((ulong)(o->u32).lo + 8);
  pCVar2 = cts->tab;
  if ((pCVar2[uVar1].info & 0xf0800000) == 0x20800000) {
    sp = *(uint8_t **)sp;
    uVar3 = pCVar2[uVar1].info & 0xffff;
  }
  uVar5 = (ulong)uVar3 * 0x10;
  uVar3 = pCVar2[uVar3].info;
  if ((uVar3 & 0xf0000000) == 0x50000000) {
    uVar5 = (ulong)((uVar3 & 0xffff) << 4);
    uVar3 = *(uint *)((long)&pCVar2->info + uVar5);
  }
  s = (CType *)((long)&pCVar2->info + uVar5);
  if (((uVar3 & 0xfc800000) == 0x800000) && (s->size == 8)) {
    uVar3 = 0xc;
  }
  else {
    uVar3 = *id;
    if (uVar3 != 0) goto LAB_0014998e;
    uVar3 = 0xb;
  }
  *id = uVar3;
LAB_0014998e:
  lj_cconv_ct_ct(cts,pCVar2 + uVar3,s,(uint8_t *)&x,sp,narg << 8);
  return x;
}

Assistant:

uint64_t lj_carith_check64(lua_State *L, int narg, CTypeID *id)
{
  TValue *o = L->base + narg-1;
  if (o >= L->top) {
  err:
    lj_err_argt(L, narg, LUA_TNUMBER);
  } else if (LJ_LIKELY(tvisnumber(o))) {
    /* Handled below. */
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(L);
    uint8_t *sp = (uint8_t *)cdataptr(cdataV(o));
    CTypeID sid = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, sid);
    uint64_t x;
    if (ctype_isref(s->info)) {
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isenum(s->info)) s = ctype_child(cts, s);
    if ((s->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && s->size == 8)
      *id = CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    else if (!*id)
      *id = CTID_INT64;  /* Use int64_t, unless already set. */
    lj_cconv_ct_ct(cts, ctype_get(cts, *id), s,
		   (uint8_t *)&x, sp, CCF_ARG(narg));
    return x;
  } else if (!(tvisstr(o) && lj_strscan_number(strV(o), o))) {
    goto err;
  }
  if (LJ_LIKELY(tvisint(o))) {
    return (uint32_t)intV(o);
  } else {
    return (uint32_t)lj_num2bit(numV(o));
  }
}